

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double find_split_std_gain_weighted<double,double>
                 (double *x,size_t n,double *sd_arr,GainCriterion criterion,double min_gain,
                 double *split_point,double *w,size_t *sorted_ix)

{
  double dVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double cumw;
  double local_38;
  
  dVar6 = calc_sd_right_to_left_weighted<double,double>(x,n,sd_arr,w,&local_38,sorted_ix);
  sVar4 = *sorted_ix;
  dVar8 = 0.0;
  dVar11 = 0.0;
  dVar9 = 0.0;
  lVar2 = 0;
  dVar7 = x[sVar4];
  dVar12 = x[sVar4];
  dVar13 = -INFINITY;
  lVar3 = 0;
  do {
    while( true ) {
      lVar5 = lVar2;
      if (n - 1 == lVar5) {
        if (dVar13 != -INFINITY) {
          dVar7 = midpoint<double>(x[sorted_ix[lVar3]],x[sorted_ix[lVar3 + 1]]);
          *split_point = dVar7;
        }
        return dVar13;
      }
      dVar1 = w[sVar4];
      dVar9 = dVar9 + dVar1;
      dVar11 = dVar11 + ((dVar12 - dVar11) * dVar1) / dVar9;
      dVar8 = dVar8 + (dVar12 - dVar7) * (dVar12 - dVar11) * dVar1;
      sVar4 = sorted_ix[lVar5 + 1];
      dVar1 = x[sVar4];
      dVar7 = dVar11;
      if ((dVar12 != dVar1) || (NAN(dVar12) || NAN(dVar1))) break;
LAB_0017fccb:
      lVar2 = lVar5 + 1;
      dVar12 = dVar1;
    }
    dVar12 = 0.0;
    if (lVar5 != 0) {
      dVar12 = SQRT(dVar8 / dVar9);
    }
    if (criterion == Pooled) {
      dVar10 = ((dVar9 / local_38) * dVar12 + ((local_38 - dVar9) / local_38) * sd_arr[lVar5 + 1]) *
               (-1.0 / dVar6) + 1.0;
    }
    else {
      dVar10 = 1.0 - (dVar12 + sd_arr[lVar5 + 1]) / (dVar6 + dVar6);
    }
    if ((dVar10 <= dVar13) || (dVar10 <= min_gain)) goto LAB_0017fccb;
    lVar2 = lVar5 + 1;
    dVar12 = dVar1;
    dVar13 = dVar10;
    lVar3 = lVar5;
  } while( true );
}

Assistant:

double find_split_std_gain_weighted(real_t *restrict x, size_t n, double *restrict sd_arr,
                                    GainCriterion criterion, double min_gain, double &restrict split_point,
                                    double *restrict w, size_t *restrict sorted_ix)
{
    ldouble_safe cumw;
    double full_sd = calc_sd_right_to_left_weighted(x, n, sd_arr, w, cumw, sorted_ix);
    ldouble_safe running_mean = 0;
    ldouble_safe running_ssq = 0;
    ldouble_safe mean_prev = x[sorted_ix[0]];
    double best_gain = -HUGE_VAL;
    double this_sd, this_gain;
    double w_this;
    ldouble_safe currw = 0;
    size_t best_ix = 0;

    for (size_t row = 0; row < n-1; row++)
    {
        w_this = w[sorted_ix[row]];
        currw += w_this;
        running_mean   += w_this * (x[sorted_ix[row]] - running_mean) / currw;
        running_ssq    += w_this * ((x[sorted_ix[row]] - running_mean) * (x[sorted_ix[row]] - mean_prev));
        mean_prev       =  running_mean;
        if (x[sorted_ix[row]] == x[sorted_ix[row+1]])
            continue;

        this_sd = (row == 0)? 0. : std::sqrt(running_ssq / currw);
        this_gain = (criterion == Pooled)?
                    pooled_gain(full_sd, cumw, this_sd, sd_arr[row+1], currw, cumw-currw)
                        :
                    sd_gain(full_sd, this_sd, sd_arr[row+1]);
        if (this_gain > best_gain && this_gain > min_gain)
        {
            best_gain = this_gain;
            best_ix = row;
        }
    }

    if (best_gain > -HUGE_VAL)
        split_point = midpoint(x[sorted_ix[best_ix]], x[sorted_ix[best_ix+1]]);

    return best_gain;
}